

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O2

int BUFFER_content(BUFFER_HANDLE handle,uchar **content)

{
  int iVar1;
  
  iVar1 = 0x131;
  if (content != (uchar **)0x0 && handle != (BUFFER_HANDLE)0x0) {
    *content = handle->buffer;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int BUFFER_content(BUFFER_HANDLE handle, const unsigned char** content)
{
    int result;
    if ((handle == NULL) || (content == NULL))
    {
        /* Codes_SRS_BUFFER_07_020: [If the handle and/or content*is NULL BUFFER_content shall return nonzero.] */
        result = MU_FAILURE;
    }
    else
    {
        BUFFER* b = (BUFFER*)handle;
        *content = b->buffer;
        result = 0;
    }
    return result;
}